

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O1

void lj_str_resize(lua_State *L,MSize newmask)

{
  long *plVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong *puVar4;
  ulong *puVar5;
  byte bVar6;
  uint uVar7;
  StrHash SVar8;
  void *__s;
  ulong uVar9;
  ulong uVar10;
  GCstr *s;
  undefined8 *puVar11;
  ulong uVar12;
  bool bVar13;
  
  if ((newmask < 0x3ffffff) &&
     (puVar2 = (undefined8 *)(L->glref).ptr64, *(char *)((long)puVar2 + 0x21) != '\x03')) {
    lVar3 = puVar2[0x13];
    uVar12 = (ulong)(newmask * 8 + 8);
    __s = lj_mem_realloc(L,(void *)0x0,0,uVar12);
    memset(__s,0,uVar12);
    if (*(char *)((long)puVar2 + 0xad) != '\0') {
      uVar12 = (ulong)*(uint *)(puVar2 + 0x14);
      if (uVar12 != 0xffffffff) {
        do {
          for (puVar11 = (undefined8 *)(*(ulong *)(lVar3 + uVar12 * 8) & 0xfffffffffffffffe);
              puVar11 != (undefined8 *)0x0; puVar11 = (undefined8 *)*puVar11) {
            if (*(char *)((long)puVar11 + 0xb) == '\0') {
              uVar7 = *(uint *)(puVar11 + 2);
            }
            else {
              uVar7 = hash_sparse(puVar2[0x16],(char *)(puVar11 + 3),
                                  *(MSize *)((long)puVar11 + 0x14));
            }
            plVar1 = (long *)((long)__s + (ulong)(uVar7 & newmask) * 8);
            *plVar1 = *plVar1 + 1;
          }
          bVar13 = uVar12 != 0;
          uVar12 = uVar12 - 1;
        } while (bVar13);
      }
      bVar6 = 0;
      if (newmask != 0xffffffff) {
        uVar12 = (ulong)newmask;
        do {
          bVar13 = 0x20 < *(ulong *)((long)__s + uVar12 * 8);
          bVar6 = bVar6 | bVar13;
          *(ulong *)((long)__s + uVar12 * 8) = (ulong)bVar13;
          bVar13 = uVar12 != 0;
          uVar12 = uVar12 - 1;
        } while (bVar13);
      }
      *(byte *)((long)puVar2 + 0xad) = bVar6;
    }
    uVar12 = (ulong)*(uint *)(puVar2 + 0x14);
    if (uVar12 != 0xffffffff) {
      do {
        puVar5 = (ulong *)(*(ulong *)(lVar3 + uVar12 * 8) & 0xfffffffffffffffe);
        while (puVar5 != (ulong *)0x0) {
          puVar4 = (ulong *)*puVar5;
          uVar7 = (uint)puVar5[2];
          if (*(char *)((long)puVar5 + 0xb) == '\0') {
            uVar9 = (ulong)(uVar7 & newmask);
            uVar10 = *(ulong *)((long)__s + uVar9 * 8);
            if ((uVar10 & 1) != 0) {
              SVar8 = hash_dense(puVar2[0x16],uVar7,(char *)(puVar5 + 3),
                                 *(MSize *)((long)puVar5 + 0x14));
              *(StrHash *)(puVar5 + 2) = SVar8;
              *(undefined1 *)((long)puVar5 + 0xb) = 1;
              uVar9 = (ulong)(SVar8 & newmask);
              uVar10 = *(ulong *)((long)__s + uVar9 * 8);
            }
          }
          else {
            SVar8 = hash_sparse(puVar2[0x16],(char *)(puVar5 + 3),*(MSize *)((long)puVar5 + 0x14));
            uVar9 = (ulong)(SVar8 & newmask);
            uVar10 = *(ulong *)((long)__s + uVar9 * 8);
            if ((uVar10 & 1) == 0) {
              *(StrHash *)(puVar5 + 2) = SVar8;
              *(undefined1 *)((long)puVar5 + 0xb) = 0;
            }
            else {
              uVar9 = (ulong)(uVar7 & newmask);
              uVar10 = *(ulong *)((long)__s + uVar9 * 8);
            }
          }
          *puVar5 = uVar10 & 0xfffffffffffffffe;
          *(ulong *)((long)__s + uVar9 * 8) = (ulong)((uint)uVar10 & 1) | (ulong)puVar5;
          puVar5 = puVar4;
        }
        bVar13 = uVar12 != 0;
        uVar12 = uVar12 - 1;
      } while (bVar13);
    }
    puVar2[2] = puVar2[2] + (ulong)(*(int *)(puVar2 + 0x14) + 1) * -8;
    (*(code *)*puVar2)(puVar2[1],puVar2[0x13],(ulong)(*(int *)(puVar2 + 0x14) + 1) * 8,0);
    puVar2[0x13] = __s;
    *(MSize *)(puVar2 + 0x14) = newmask;
  }
  return;
}

Assistant:

void lj_str_resize(lua_State *L, MSize newmask)
{
  global_State *g = G(L);
  GCRef *newtab, *oldtab = g->str.tab;
  MSize i;

  /* No resizing during GC traversal or if already too big. */
  if (g->gc.state == GCSsweepstring || newmask >= LJ_MAX_STRTAB-1)
    return;

  newtab = lj_mem_newvec(L, newmask+1, GCRef);
  memset(newtab, 0, (newmask+1)*sizeof(GCRef));

#if LUAJIT_SECURITY_STRHASH
  /* Check which chains need secondary hashes. */
  if (g->str.second) {
    int newsecond = 0;
    /* Compute primary chain lengths. */
    for (i = g->str.mask; i != ~(MSize)0; i--) {
      GCobj *o = (GCobj *)(gcrefu(oldtab[i]) & ~(uintptr_t)1);
      while (o) {
	GCstr *s = gco2str(o);
	MSize hash = s->hashalg ? hash_sparse(g->str.seed, strdata(s), s->len) :
				  s->hash;
	hash &= newmask;
	setgcrefp(newtab[hash], gcrefu(newtab[hash]) + 1);
	o = gcnext(o);
      }
    }
    /* Mark secondary chains. */
    for (i = newmask; i != ~(MSize)0; i--) {
      int secondary = gcrefu(newtab[i]) > LJ_STR_MAXCOLL;
      newsecond |= secondary;
      setgcrefp(newtab[i], secondary);
    }
    g->str.second = newsecond;
  }
#endif

  /* Reinsert all strings from the old table into the new table. */
  for (i = g->str.mask; i != ~(MSize)0; i--) {
    GCobj *o = (GCobj *)(gcrefu(oldtab[i]) & ~(uintptr_t)1);
    while (o) {
      GCobj *next = gcnext(o);
      GCstr *s = gco2str(o);
      MSize hash = s->hash;
#if LUAJIT_SECURITY_STRHASH
      uintptr_t u;
      if (LJ_LIKELY(!s->hashalg)) {  /* String hashed with primary hash. */
	hash &= newmask;
	u = gcrefu(newtab[hash]);
	if (LJ_UNLIKELY(u & 1)) {  /* Switch string to secondary hash. */
	  s->hash = hash = hash_dense(g->str.seed, s->hash, strdata(s), s->len);
	  s->hashalg = 1;
	  hash &= newmask;
	  u = gcrefu(newtab[hash]);
	}
      } else {  /* String hashed with secondary hash. */
	MSize shash = hash_sparse(g->str.seed, strdata(s), s->len);
	u = gcrefu(newtab[shash & newmask]);
	if (u & 1) {
	  hash &= newmask;
	  u = gcrefu(newtab[hash]);
	} else {  /* Revert string back to primary hash. */
	  s->hash = shash;
	  s->hashalg = 0;
	  hash = (shash & newmask);
	}
      }
      /* NOBARRIER: The string table is a GC root. */
      setgcrefp(o->gch.nextgc, (u & ~(uintptr_t)1));
      setgcrefp(newtab[hash], ((uintptr_t)o | (u & 1)));
#else
      hash &= newmask;
      /* NOBARRIER: The string table is a GC root. */
      setgcrefr(o->gch.nextgc, newtab[hash]);
      setgcref(newtab[hash], o);
#endif
      o = next;
    }
  }

  /* Free old table and replace with new table. */
  lj_str_freetab(g);
  g->str.tab = newtab;
  g->str.mask = newmask;
}